

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

bool __thiscall
ON_PolyEdgeHistoryValue::ReportHelper(ON_PolyEdgeHistoryValue *this,ON_TextLog *text_log)

{
  int iVar1;
  ON_PolyEdgeHistory *this_00;
  int local_1c;
  int count;
  int i;
  ON_TextLog *text_log_local;
  ON_PolyEdgeHistoryValue *this_local;
  
  ON_TextLog::Print(text_log,"polyedge value\n");
  ON_TextLog::PushIndent(text_log);
  iVar1 = ON_ClassArray<ON_PolyEdgeHistory>::Count(&this->m_value);
  for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
    this_00 = ON_ClassArray<ON_PolyEdgeHistory>::operator[](&this->m_value,local_1c);
    ON_PolyEdgeHistory::Dump(this_00,text_log);
  }
  ON_TextLog::PopIndent(text_log);
  return true;
}

Assistant:

bool ON_PolyEdgeHistoryValue::ReportHelper(ON_TextLog& text_log ) const
{
  text_log.Print("polyedge value\n");
  text_log.PushIndent();
  int i, count = m_value.Count();
  for ( i = 0; i < count; i++ )
  {
    m_value[i].Dump(text_log);
  }
  text_log.PopIndent();
  return true;
}